

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O1

edata_t * duckdb_je_edata_heap_first(edata_heap_t *ph)

{
  void *pvVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  pvVar1 = (ph->ph).root;
  if (pvVar1 == (void *)0x0) {
    return (edata_t *)0x0;
  }
  (ph->ph).auxcount = 0;
  lVar6 = *(long *)((long)pvVar1 + 0x30);
  if (lVar6 != 0) {
    *(undefined8 *)((long)pvVar1 + 0x28) = 0;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    *(undefined8 *)(lVar6 + 0x28) = 0;
    lVar8 = *(long *)(lVar6 + 0x30);
    if (lVar8 != 0) {
      lVar9 = *(long *)(lVar8 + 0x30);
      if (lVar9 != 0) {
        *(undefined8 *)(lVar9 + 0x28) = 0;
      }
      *(undefined8 *)(lVar6 + 0x28) = 0;
      *(undefined8 *)(lVar6 + 0x30) = 0;
      *(undefined8 *)(lVar8 + 0x28) = 0;
      *(undefined8 *)(lVar8 + 0x30) = 0;
      uVar2 = *(ulong *)(lVar6 + 0x20);
      uVar3 = *(ulong *)(lVar8 + 0x20);
      if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
               (uint)(*(ulong *)(lVar6 + 8) < *(ulong *)(lVar8 + 8))) < 0) {
        *(long *)(lVar8 + 0x28) = lVar6;
        lVar7 = *(long *)(lVar6 + 0x38);
        *(long *)(lVar8 + 0x30) = lVar7;
        if (lVar7 != 0) {
          *(long *)(lVar7 + 0x28) = lVar8;
        }
        *(long *)(lVar6 + 0x38) = lVar8;
        lVar8 = lVar6;
      }
      else {
        *(long *)(lVar6 + 0x28) = lVar8;
        lVar7 = *(long *)(lVar8 + 0x38);
        *(long *)(lVar6 + 0x30) = lVar7;
        if (lVar7 != 0) {
          *(long *)(lVar7 + 0x28) = lVar6;
        }
        *(long *)(lVar8 + 0x38) = lVar6;
        lVar6 = lVar8;
      }
      while (lVar7 = lVar9, lVar7 != 0) {
        lVar4 = *(long *)(lVar7 + 0x30);
        if (lVar4 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = *(long *)(lVar4 + 0x30);
          if (lVar9 != 0) {
            *(undefined8 *)(lVar9 + 0x28) = 0;
          }
          *(undefined8 *)(lVar7 + 0x28) = 0;
          *(undefined8 *)(lVar7 + 0x30) = 0;
          *(undefined8 *)(lVar4 + 0x28) = 0;
          *(undefined8 *)(lVar4 + 0x30) = 0;
          uVar2 = *(ulong *)(lVar7 + 0x20);
          uVar3 = *(ulong *)(lVar4 + 0x20);
          if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
                   (uint)(*(ulong *)(lVar7 + 8) < *(ulong *)(lVar4 + 8))) < 0) {
            *(long *)(lVar4 + 0x28) = lVar7;
            lVar5 = *(long *)(lVar7 + 0x38);
            *(long *)(lVar4 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar4;
            }
            *(long *)(lVar7 + 0x38) = lVar4;
          }
          else {
            *(long *)(lVar7 + 0x28) = lVar4;
            lVar5 = *(long *)(lVar4 + 0x38);
            *(long *)(lVar7 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar7;
            }
            *(long *)(lVar4 + 0x38) = lVar7;
            lVar7 = lVar4;
          }
        }
        *(long *)(lVar8 + 0x30) = lVar7;
        lVar8 = lVar7;
      }
      lVar7 = *(long *)(lVar6 + 0x30);
      lVar9 = lVar6;
      if (lVar7 != 0) {
        while( true ) {
          lVar6 = lVar9;
          lVar9 = *(long *)(lVar7 + 0x30);
          *(undefined8 *)(lVar6 + 0x30) = 0;
          *(undefined8 *)(lVar7 + 0x30) = 0;
          if (lVar7 != 0) {
            uVar2 = *(ulong *)(lVar6 + 0x20);
            uVar3 = *(ulong *)(lVar7 + 0x20);
            if ((int)(((uint)(uVar2 >= uVar3 && uVar2 != uVar3) - (uint)(uVar2 < uVar3)) * 2 -
                     (uint)(*(ulong *)(lVar6 + 8) < *(ulong *)(lVar7 + 8))) < 0) {
              *(long *)(lVar7 + 0x28) = lVar6;
              lVar4 = *(long *)(lVar6 + 0x38);
              *(long *)(lVar7 + 0x30) = lVar4;
              if (lVar4 != 0) {
                *(long *)(lVar4 + 0x28) = lVar7;
              }
              *(long *)(lVar6 + 0x38) = lVar7;
            }
            else {
              *(long *)(lVar6 + 0x28) = lVar7;
              lVar4 = *(long *)(lVar7 + 0x38);
              *(long *)(lVar6 + 0x30) = lVar4;
              if (lVar4 != 0) {
                *(long *)(lVar4 + 0x28) = lVar6;
              }
              *(long *)(lVar7 + 0x38) = lVar6;
              lVar6 = lVar7;
            }
          }
          if (lVar9 == 0) break;
          *(long *)(lVar8 + 0x30) = lVar6;
          lVar7 = *(long *)(lVar9 + 0x30);
          lVar8 = lVar6;
        }
      }
    }
    *(void **)(lVar6 + 0x28) = pvVar1;
    lVar8 = *(long *)((long)pvVar1 + 0x38);
    *(long *)(lVar6 + 0x30) = lVar8;
    if (lVar8 != 0) {
      *(long *)(lVar8 + 0x28) = lVar6;
    }
    *(long *)((long)pvVar1 + 0x38) = lVar6;
  }
  return (edata_t *)(ph->ph).root;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void *
ph_first(ph_t *ph, size_t offset, ph_cmp_t cmp) {
	if (ph->root == NULL) {
		return NULL;
	}
	ph_merge_aux(ph, offset, cmp);
	return ph->root;
}